

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O2

void duckdb::ParquetDecodeUtils::SkipAligned(ByteBuffer *src,idx_t count,bitpacking_width_t width)

{
  InvalidInputException *this;
  allocator local_39;
  string local_38;
  
  CheckWidth(width);
  if ((count & 0x1f) == 0) {
    ByteBuffer::inc(src,(width * count) / 8);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Aligned bitpacking count must be a multiple of %llu",&local_39);
  InvalidInputException::InvalidInputException<unsigned_long>(this,&local_38,0x20);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void SkipAligned(ByteBuffer &src, const idx_t count, const bitpacking_width_t width) {
		CheckWidth(width);
		if (count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
			throw InvalidInputException("Aligned bitpacking count must be a multiple of %llu",
			                            BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE);
		}
		const auto read_size = count * width / BITPACK_DLEN;
		src.inc(read_size);
	}